

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O2

void Eigen::internal::
     general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::
     run(long size,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,ResScalar *res
        ,long resStride,ResScalar *alpha)

{
  ResScalar alpha_00;
  double *blockA;
  undefined1 *puVar1;
  long lVar2;
  double *pdVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  double *blockB;
  long lVar7;
  long lVar8;
  double dStack_d8;
  long local_d0;
  long nc;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> allocatedBlockB_stack_memory_destructor;
  long local_48;
  long kc;
  long mc;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> sybb;
  
  pdVar3 = &dStack_d8;
  local_d0 = size;
  local_48 = depth;
  kc = size;
  computeProductBlockingSizes<double,double,1,long>(&local_48,&kc,&local_d0);
  lVar2 = local_48;
  if (4 < kc) {
    kc = kc & 0x7ffffffffffffffc;
  }
  if ((ulong)(kc * local_48) >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  uVar5 = (size + 8) * lVar2;
  sVar4 = local_48 * kc * 8;
  if (sVar4 < 0x20001) {
    blockA = (double *)((long)&dStack_d8 - (sVar4 + 0xf & 0xfffffffffffffff0));
    blockA_stack_memory_destructor.m_size._0_1_ = false;
    pdVar3 = blockA;
  }
  else {
    blockA = (double *)aligned_malloc(sVar4);
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < (ulong)(local_48 * kc * 8);
  }
  nc = (long)blockA;
  blockA_stack_memory_destructor.m_ptr = (double *)(kc * local_48);
  if (0x1fffffffffffffff < uVar5) {
    pdVar3[-1] = 5.379683191307e-318;
    throw_std_bad_alloc();
  }
  sVar4 = uVar5 * 8;
  if (sVar4 < 0x20001) {
    puVar1 = (undefined1 *)((long)pdVar3 - (sVar4 + 0xf & 0xfffffffffffffff0));
    pdVar3 = (double *)puVar1;
  }
  else {
    pdVar3[-1] = 5.379920342817e-318;
    puVar1 = (undefined1 *)aligned_malloc(sVar4);
  }
  blockA_stack_memory_destructor._16_8_ = puVar1;
  blockB = (double *)(lVar2 * 0x40 + (long)puVar1);
  for (lVar2 = 0; lVar2 < depth; lVar2 = lVar2 + local_48) {
    lVar6 = local_48 + lVar2;
    if (depth <= local_48 + lVar2) {
      lVar6 = depth;
    }
    lVar6 = lVar6 - lVar2;
    *(undefined8 *)((long)pdVar3 + -0x10) = 0;
    *(undefined8 *)((long)pdVar3 + -8) = 0;
    *(undefined8 *)((long)pdVar3 + -0x18) = 0x109e18;
    gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
              ((gemm_pack_rhs<double,_long,_4,_1,_false,_false> *)((long)&mc + 5),blockB,
               _rhs + lVar2 * rhsStride,rhsStride,lVar6,size,*(long *)((long)pdVar3 + -0x10),
               *(long *)((long)pdVar3 + -8));
    for (lVar7 = 0; lVar7 < size; lVar7 = lVar7 + kc) {
      lVar8 = kc + lVar7;
      if (size <= kc + lVar7) {
        lVar8 = size;
      }
      lVar8 = lVar8 - lVar7;
      *(undefined8 *)((long)pdVar3 + -0x10) = 0;
      *(undefined8 *)((long)pdVar3 + -8) = 0;
      *(undefined8 *)((long)pdVar3 + -0x18) = 0x109e81;
      gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&mc + 4),blockA,
                 _lhs + lVar2 * lhsStride + lVar7,lhsStride,lVar6,lVar8,
                 *(long *)((long)pdVar3 + -0x10),*(long *)((long)pdVar3 + -8));
      alpha_00 = *alpha;
      *(undefined1 **)((long)pdVar3 + -0x10) = puVar1;
      *(undefined8 *)((long)pdVar3 + -0x20) = 0;
      *(undefined8 *)((long)pdVar3 + -0x18) = 0;
      *(undefined8 *)((long)pdVar3 + -0x28) = 0xffffffffffffffff;
      *(long *)((long)pdVar3 + -0x38) = lVar7;
      *(undefined8 *)((long)pdVar3 + -0x30) = 0xffffffffffffffff;
      *(long *)((long)pdVar3 + -0x40) = lVar6;
      *(undefined8 *)((long)pdVar3 + -0x48) = 0x109ed0;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&mc + 6),
                 res + lVar7,resStride,blockA,blockB,lVar8,*(long *)((long)pdVar3 + -0x40),
                 *(long *)((long)pdVar3 + -0x38),alpha_00,*(long *)((long)pdVar3 + -0x30),
                 *(long *)((long)pdVar3 + -0x28),*(long *)((long)pdVar3 + -0x20),
                 *(long *)((long)pdVar3 + -0x18),*(double **)((long)pdVar3 + -0x10));
      *(undefined1 **)((long)pdVar3 + -0x10) = puVar1;
      *(ResScalar **)((long)pdVar3 + -0x18) = alpha;
      *(long *)((long)pdVar3 + -0x20) = lVar6;
      *(undefined8 *)((long)pdVar3 + -0x28) = 0x109f13;
      tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
                ((tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *)((long)&mc + 7),
                 res + lVar7 * resStride + lVar7,resStride,blockA,blockB + lVar7 * lVar6,lVar8,
                 *(long *)((long)pdVar3 + -0x20),*(ResScalar **)((long)pdVar3 + -0x18),
                 *(double **)((long)pdVar3 + -0x10));
    }
  }
  *(undefined8 *)((long)pdVar3 + -8) = 0x109f44;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  *(undefined8 *)((long)pdVar3 + -8) = 0x109f50;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&nc);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Index size, Index depth,const LhsScalar* _lhs, Index lhsStride,
                                      const RhsScalar* _rhs, Index rhsStride, ResScalar* res, Index resStride, const ResScalar& alpha)
  {
    const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
    const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

    typedef gebp_traits<LhsScalar,RhsScalar> Traits;

    Index kc = depth; // cache block size along the K direction
    Index mc = size;  // cache block size along the M direction
    Index nc = size;  // cache block size along the N direction
    computeProductBlockingSizes<LhsScalar,RhsScalar>(kc, mc, nc);
    // !!! mc must be a multiple of nr:
    if(mc > Traits::nr)
      mc = (mc/Traits::nr)*Traits::nr;

    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    std::size_t sizeB = sizeW + kc*size;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, kc*mc, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, allocatedBlockB, sizeB, 0);
    RhsScalar* blockB = allocatedBlockB + sizeW;
    
    gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
    gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
    gebp_kernel <LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;
    tribb_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs, UpLo> sybb;

    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // note that the actual rhs is the transpose/adjoint of mat
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, size);

      for(Index i2=0; i2<size; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,size)-i2;

        pack_lhs(blockA, &lhs(i2, k2), lhsStride, actual_kc, actual_mc);

        // the selected actual_mc * size panel of res is split into three different part:
        //  1 - before the diagonal => processed with gebp or skipped
        //  2 - the actual_mc x actual_mc symmetric block => processed with a special kernel
        //  3 - after the diagonal => processed with gebp or skipped
        if (UpLo==Lower)
          gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, (std::min)(size,i2), alpha,
               -1, -1, 0, 0, allocatedBlockB);

        sybb(res+resStride*i2 + i2, resStride, blockA, blockB + actual_kc*i2, actual_mc, actual_kc, alpha, allocatedBlockB);

        if (UpLo==Upper)
        {
          Index j2 = i2+actual_mc;
          gebp(res+resStride*j2+i2, resStride, blockA, blockB+actual_kc*j2, actual_mc, actual_kc, (std::max)(Index(0), size-j2), alpha,
               -1, -1, 0, 0, allocatedBlockB);
        }
      }
    }
  }